

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O3

void uint_hash_clear(uint_hash *h)

{
  uint_hash_entry **ppuVar1;
  uint uVar2;
  uint_hash_entry *puVar3;
  ulong uVar4;
  
  if (((h != (uint_hash *)0x0) && (h->table != (uint_hash_entry **)0x0)) &&
     (uVar2 = h->slots, uVar2 != 0)) {
    uVar4 = 0;
    do {
      ppuVar1 = h->table;
      puVar3 = ppuVar1[uVar4];
      if (puVar3 != (uint_hash_entry *)0x0) {
        do {
          ppuVar1[uVar4] = puVar3->next;
          h->size = h->size - 1;
          if (puVar3->value != (void *)0x0) {
            if (h->dtor != (Curl_uint_hash_dtor *)0x0) {
              (*h->dtor)(puVar3->id,puVar3->value);
            }
            puVar3->value = (void *)0x0;
          }
          (*Curl_cfree)(puVar3);
          puVar3 = ppuVar1[uVar4];
        } while (puVar3 != (uint_hash_entry *)0x0);
        uVar2 = h->slots;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar2);
  }
  return;
}

Assistant:

static void uint_hash_clear(struct uint_hash *h)
{
  if(h && h->table) {
    struct uint_hash_entry *he, **he_anchor;
    size_t i;
    DEBUGASSERT(h->init == CURL_UINTHASHINIT);
    for(i = 0; i < h->slots; ++i) {
      he_anchor = &h->table[i];
      while(*he_anchor) {
        he = *he_anchor;
        uint_hash_entry_unlink(h, he_anchor, he);
        uint_hash_entry_destroy(h, he);
      }
    }
  }
}